

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertPthreadMutexLock(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  LockNode *node;
  NodeSequence NVar2;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
  if (pFVar1 == (Function *)0x0) {
    node = createNode<(NodeType)3,decltype(nullptr),llvm::CallInst_const*>
                     ((void *)0x0,callInstruction);
  }
  else {
    node = createNode<(NodeType)3,llvm::CallInst_const*>(callInstruction);
  }
  NVar2.first = addNode<LockNode>(this,node);
  NVar2.second = &(NVar2.first)->super_Node;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadMutexLock(const CallInst *callInstruction) {
    LockNode *lockNode;
    if (callInstruction->getCalledFunction()) {
        lockNode = addNode(createNode<NodeType::LOCK>(callInstruction));
    } else {
        lockNode =
                addNode(createNode<NodeType::LOCK>(nullptr, callInstruction));
    }

    return {lockNode, lockNode};
}